

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O1

void __thiscall catalog::catalog(catalog *this)

{
  pointer *pppTVar1;
  pointer *ppuVar2;
  iterator __position;
  iterator iVar3;
  iterator __position_00;
  size_type sVar4;
  long lVar5;
  ostream *poVar6;
  TableInfo *pTVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int *piVar11;
  bool state;
  TableInfo *tableInfo;
  int constraint;
  size_t size;
  int type;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  string indexName;
  string attributeName;
  size_t len_1;
  size_t len;
  size_t pos;
  ifstream tablelist;
  ifstream IndexNamelist;
  char local_509;
  TableInfo *local_508;
  int local_4fc;
  catalog *local_4f8;
  long local_4f0;
  int local_4e4;
  ulong local_4e0;
  undefined1 local_4d8 [8];
  char *local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  int local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  undefined1 local_4a0;
  undefined7 uStack_49f;
  value_type local_490;
  vector<TableInfo*,std::allocator<TableInfo*>> *local_470;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_468;
  int *local_460;
  long local_458;
  undefined1 local_450 [8];
  unsigned_long local_448;
  char local_440 [520];
  undefined1 local_238 [520];
  
  local_470 = (vector<TableInfo*,std::allocator<TableInfo*>> *)&this->TableInfoList;
  local_468 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->file_offset;
  this->anychangeornot = false;
  *(undefined8 *)&this->tableNumber = 0;
  *(undefined8 *)
   ((long)&(this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->file_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->file_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   ((long)&(this->file_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_4f8 = this;
  std::ifstream::ifstream(local_440,"./file/catalog/table.dat",_S_in|_S_bin);
  std::ifstream::ifstream(local_238,"./file/IndexNamelist.dat",_S_in|_S_bin);
  std::istream::seekg((long)local_440,_S_beg);
  lVar5 = std::istream::tellg();
  if (lVar5 != 0) {
    std::istream::seekg((long)local_440,_S_beg);
    piVar11 = &local_4f8->tableNumber;
    std::istream::read(local_440,(long)piVar11);
    poVar6 = (ostream *)std::ostream::operator<<(&std::cout,*piVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," tables in total",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (0 < *piVar11) {
      local_4e0 = 0;
      local_460 = piVar11;
      do {
        local_448 = std::istream::tellg();
        __position._M_current =
             (local_4f8->file_offset).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (local_4f8->file_offset).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(local_468,__position,&local_448);
        }
        else {
          *__position._M_current = local_448;
          (local_4f8->file_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        std::istream::read(local_440,(long)&local_509);
        std::istream::read(local_440,(long)local_450);
        if (local_509 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"find deleted table",0x12);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
          std::ostream::put('0');
          std::ostream::flush();
          std::istream::seekg((long)local_440,local_450._0_4_);
          std::istream::tellg();
          poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          ppuVar2 = &(local_4f8->file_offset).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar2 = *ppuVar2 + -1;
        }
        else {
          pTVar7 = (TableInfo *)operator_new(0xd8);
          TableInfo::TableInfo(pTVar7);
          local_508 = pTVar7;
          std::istream::read(local_440,(long)&local_4f0);
          pcVar8 = (char *)operator_new__(local_4f0 + 1);
          std::istream::read(local_440,(long)pcVar8);
          pTVar7 = local_508;
          pcVar8[local_4f0] = '\0';
          pcVar9 = (char *)(local_508->tableName)._M_string_length;
          strlen(pcVar8);
          std::__cxx11::string::_M_replace((ulong)pTVar7,0,pcVar9,(ulong)pcVar8);
          std::istream::read(local_440,(long)&local_508->attributeNum);
          if (0 < local_508->attributeNum) {
            iVar10 = 0;
            do {
              local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
              local_490._M_string_length = 0;
              local_490.field_2._M_local_buf[0] = '\0';
              std::istream::read(local_440,(long)&local_4f0);
              pcVar9 = (char *)operator_new__(local_4f0 + 1);
              std::istream::read(local_440,(long)pcVar9);
              sVar4 = local_490._M_string_length;
              pcVar9[local_4f0] = '\0';
              strlen(pcVar9);
              std::__cxx11::string::_M_replace((ulong)&local_490,0,(char *)sVar4,(ulong)pcVar9);
              std::istream::read(local_440,(long)&local_4e4);
              std::istream::read(local_440,(long)&local_4fc);
              if (local_4fc - 3U < 2) {
                if (local_4fc == 3) {
                  local_508->primary_key_id = iVar10;
                }
                local_4b0 = &local_4a0;
                local_4a8 = (char *)0x0;
                local_4a0 = 0;
                std::istream::read(local_440,(long)&local_458);
                pcVar8 = (char *)operator_new__(local_458 + 1);
                std::istream::read(local_440,(long)pcVar8);
                pcVar9 = local_4a8;
                pcVar8[local_4f0] = '\0';
                strlen(pcVar8);
                std::__cxx11::string::_M_replace((ulong)&local_4b0,0,pcVar9,(ulong)pcVar8);
                local_4d8._0_4_ = iVar10;
                local_4d0 = local_4c8._M_local_buf + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4d0,local_4b0,local_4a8 + (long)local_4b0);
                std::
                _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<int,std::__cxx11::string>&>
                          ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                            *)&local_508->indexInfo,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_4d8);
                if (local_4d0 != local_4c8._M_local_buf + 8) {
                  operator_delete(local_4d0,local_4c8._8_8_ + 1);
                }
                if (local_4b0 != &local_4a0) {
                  operator_delete(local_4b0,CONCAT71(uStack_49f,local_4a0) + 1);
                }
              }
              iVar3._M_current =
                   (local_508->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (local_508->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_508->type,iVar3,&local_4e4);
              }
              else {
                *iVar3._M_current = local_4e4;
                (local_508->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_508->attributeName,&local_490);
              iVar3._M_current =
                   (local_508->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (local_508->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_508->constraint,iVar3,
                           &local_4fc);
              }
              else {
                *iVar3._M_current = local_4fc;
                (local_508->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              local_4d8 = (undefined1  [8])&local_4c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_4d8,local_490._M_dataplus._M_p,
                         (char *)(local_490._M_string_length + (long)local_490._M_dataplus._M_p));
              local_4b8 = iVar10;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,int>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                          *)&local_508->getID,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                          *)local_4d8);
              if (local_4d8 != (undefined1  [8])&local_4c8) {
                operator_delete((void *)local_4d8,local_4c8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_490._M_dataplus._M_p != &local_490.field_2) {
                operator_delete(local_490._M_dataplus._M_p,
                                CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                                         local_490.field_2._M_local_buf[0]) + 1);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < local_508->attributeNum);
          }
          __position_00._M_current =
               (local_4f8->TableInfoList).
               super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (local_4f8->TableInfoList).
              super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<TableInfo*,std::allocator<TableInfo*>>::_M_realloc_insert<TableInfo*const&>
                      (local_470,__position_00,&local_508);
          }
          else {
            *__position_00._M_current = local_508;
            pppTVar1 = &(local_4f8->TableInfoList).
                        super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"load table :",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(local_508->tableName)._M_dataplus._M_p,
                              (local_508->tableName)._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          local_4e0 = (ulong)((int)local_4e0 + 1);
          piVar11 = local_460;
        }
      } while ((int)local_4e0 < *piVar11);
    }
    std::ifstream::close();
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_238);
  std::ifstream::~ifstream(local_440);
  return;
}

Assistant:

catalog::catalog(){
    tableNumber = 0;
    anychangeornot = false;
    std::ifstream tablelist("./file/catalog/table.dat", std::ios::in | std::ios::binary);
    std::ifstream IndexNamelist("./file/IndexNamelist.dat", std::ios::in | std::ios::binary);
    tablelist.seekg(0,std::ios::end); 
    // std::cout << tablelist.tellg() << std::endl;
    if(tablelist.tellg() == 0){
        return;//文件为空
    }
    else{
        tablelist.seekg(0,std::ios::beg);
        tablelist.read((char*)(&tableNumber),sizeof(int));
        std::cout<<tableNumber<<" tables in total"<<std::endl;
        int i = 0;
        while(i < tableNumber){
            //usleep(1*1000000);
            size_t pos = tablelist.tellg();
            //std::cout << "offset "<<pos<<std::endl;
            file_offset.push_back(pos);
            bool state;
            tablelist.read((char*)(&state),sizeof(bool));
            //std::cout<<state<<std::endl; 
            size_t len;
            tablelist.read((char*)(&len),sizeof(len));
            if(!state){
               std::cout<<"find deleted table"<<std::endl;
                tablelist.seekg(len,std::ios::cur);//跳过被删除的table
                std::cout<<tablelist.tellg()<<std::endl;//跳过被删除的table
                file_offset.pop_back();
                continue;
            }
            i++;
            TableInfo* tableInfo = new TableInfo();
            size_t size;
            //读入table的名字
            tablelist.read((char*)(&size),sizeof(size));
            char* buf = new char[size+1];
            tablelist.read(buf, size);
            buf[size] = '\0';
            tableInfo->tableName = buf;
            //读入colunm的数目
            tablelist.read((char*)(&(tableInfo->attributeNum)),sizeof(int));
            //读入列的信息
            for(int j = 0 ; j < tableInfo->attributeNum ; j ++){
                std::string attributeName;
                int type;
                int constraint;
                //
                tablelist.read((char*)(&size),sizeof(size));
                buf = new char[size+1];
                tablelist.read(buf, size);
                buf[size] = '\0';
                attributeName = buf;
                tablelist.read((char*)(&type),sizeof(int));
                tablelist.read((char*)(&constraint),sizeof(int));
                if(constraint == 4 || constraint == 3){
                    if(constraint == 3)tableInfo->primary_key_id = j;
                    //添加index信息
                    std::string indexName;
                    size_t len;
                    tablelist.read((char*)(&len),sizeof(len));
                    buf = new char[len+1];
                    tablelist.read(buf,len);
                    buf[size] = '\0';
                    indexName = buf;
                    std::pair<int,std::string> p = std::make_pair(j, indexName);
                    // tableInfo->indexInfo.push_back(p);
                    tableInfo->indexInfo.insert(p);  
                }
                tableInfo->type.push_back(type);
                tableInfo->attributeName.push_back(attributeName);
                tableInfo->constraint.push_back(constraint);
                std::pair<std::string,int> p = std::make_pair(attributeName,j);
                tableInfo->getID.insert(p); 
            }
            TableInfoList.push_back(tableInfo);//推入tablenfolist中
            std::cout<<"load table :"<<tableInfo->tableName<<std::endl;
        }
    }
    IndexNamelist.close();
    tablelist.close();
}